

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::FocusNextInLayout(App *this)

{
  undefined8 uVar1;
  ILayoutPtr IVar2;
  undefined1 local_38 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  WindowState::ActiveLayout((WindowState *)local_38);
  uVar1 = local_38._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  if ((element_type *)uVar1 != (element_type *)0x0) {
    IVar2 = WindowState::ActiveLayout((WindowState *)local_38);
    (*((IWindowGroup *)local_38._0_8_)->_vptr_IWindowGroup[8])
              (local_38 + 0x10,local_38._0_8_,
               IVar2.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    UpdateFocusedWindow(this,(IWindowPtr *)(local_38 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  }
  return;
}

Assistant:

void App::FocusNextInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusNext());
}